

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Node * prvTidyGetToken(TidyDocImpl *doc,GetTokenMode mode)

{
  uint *puVar1;
  int *piVar2;
  char *pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  char cVar12;
  TidyTagId TVar13;
  Lexer *lexer;
  Lexer *pLVar14;
  Dict *pDVar15;
  ctmbstr s1;
  TidyAllocator *allocator;
  NodeType type;
  bool bVar16;
  tmbchar tVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  Bool BVar24;
  uint uVar25;
  Node *pNVar26;
  tmbstr ptVar27;
  AttVal *pAVar28;
  Attribute *pAVar29;
  ulong uVar30;
  tmbstr ptVar31;
  ctmbstr ptVar32;
  Node *pNVar33;
  StreamIn *pSVar34;
  ulong uVar35;
  long lVar36;
  uint uVar37;
  Bool isempty;
  ulong local_80;
  ulong local_78;
  Node *local_70;
  undefined4 local_64;
  undefined8 local_60;
  Node *asp;
  AttVal *local_50;
  undefined8 local_48;
  int delim;
  Node *php;
  
  lexer = doc->lexer;
  pNVar26 = lexer->itoken;
  if (lexer->pushed != no) {
    if (pNVar26 != (Node *)0x0) {
      lexer->pushed = no;
      return pNVar26;
    }
LAB_00130cf7:
    lexer->pushed = no;
    pNVar26 = lexer->token;
    if ((pNVar26->type == TextNode) &&
       ((lexer->insert != (IStack *)0x0 || (lexer->inode != (Node *)0x0)))) {
      pNVar26 = prvTidyInsertedToken(doc);
      lexer->itoken = pNVar26;
    }
    return pNVar26;
  }
  if (pNVar26 != (Node *)0x0) {
    lexer->itoken = (Node *)0x0;
    goto LAB_00130cf7;
  }
  if ((lexer->insert != (IStack *)0x0) || (lexer->inode != (Node *)0x0)) {
    pNVar26 = prvTidyInsertedToken(doc);
    goto LAB_00130d3d;
  }
  if (mode == CdataContent) {
    pNVar26 = lexer->parent;
    if (pNVar26 == (Node *)0x0) {
      __assert_fail("lexer->parent != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/lexer.c"
                    ,0x8e8,"Node *prvTidyGetToken(TidyDocImpl *, GetTokenMode)");
    }
    local_60 = prvTidyAttrGetById(pNVar26,TidyAttr_SRC);
    if ((pNVar26->tag == (Dict *)0x0) ||
       ((TVar13 = pNVar26->tag->id, TVar13 != TidyTag_STYLE && (TVar13 != TidyTag_SCRIPT)))) {
      local_80 = 0;
    }
    else {
      local_80 = (ulong)CONCAT31((int3)(TVar13 >> 8),*(int *)((doc->config).value + 0x5f) != 0);
    }
    local_78 = 0;
    pSVar34 = doc->docIn;
    uVar7 = pSVar34->curcol;
    uVar11 = pSVar34->curline;
    lexer->lines = uVar11;
    lexer->columns = uVar7;
    lexer->waswhite = no;
    lexer->txtend = lexer->lexsize;
    lexer->txtstart = lexer->lexsize;
    iVar23 = 0;
    bVar16 = true;
    uVar35 = 0;
    do {
      uVar21 = prvTidyReadChar(pSVar34);
      if (uVar21 == 0xffffffff) goto LAB_00131c30;
      prvTidyAddCharToLexer(lexer,uVar21);
      lexer->txtend = lexer->lexsize;
      uVar18 = (uint)uVar35;
      if (iVar23 == 1) {
        if ((uVar21 < 0x80) && ((lexmap[uVar21] & 2) != 0)) {
LAB_00131a81:
          iVar23 = 1;
        }
        else {
          ptVar32 = pNVar26->element;
          ptVar27 = lexer->lexbuf;
          uVar21 = prvTidytmbstrlen(ptVar32);
          iVar23 = prvTidytmbstrncasecmp(ptVar32,ptVar27 + uVar35,uVar21);
          local_78 = (ulong)((int)local_78 + (uint)(((byte)local_80 ^ 1) & iVar23 == 0));
LAB_00131a3c:
          iVar23 = 0;
        }
      }
      else if (iVar23 == 0) {
        if (uVar21 == 0x3c) {
          uVar21 = prvTidyReadChar(doc->docIn);
          if ((uVar21 < 0x80) && ((lexmap[uVar21] & 2) != 0)) {
            if (((bVar16 && local_60 != (AttVal *)0x0) && (pNVar26->tag != (Dict *)0x0)) &&
               (pNVar26->tag->id == TidyTag_SCRIPT)) {
              lexer->lexsize = lexer->txtstart;
              prvTidyUngetChar(uVar21,doc->docIn);
              prvTidyUngetChar(0x3c,doc->docIn);
              return (Node *)0x0;
            }
            prvTidyAddCharToLexer(lexer,uVar21);
            uVar35 = (ulong)(lexer->lexsize - 1);
            goto LAB_00131a81;
          }
          if (uVar21 == 0x5c) {
            prvTidyAddCharToLexer(lexer,0x5c);
            uVar21 = prvTidyReadChar(doc->docIn);
            if (uVar21 == 0x2f) {
              prvTidyAddCharToLexer(lexer,0x2f);
              iVar23 = 0;
              if ((char)local_80 == '\0') {
                uVar21 = prvTidyReadChar(doc->docIn);
                if ((uVar21 < 0x80) && ((lexmap[uVar21] & 2) != 0)) goto LAB_0013183d;
                prvTidyUngetChar(uVar21,doc->docIn);
                iVar23 = 0;
              }
              goto LAB_00131a85;
            }
          }
          else if (uVar21 == 0x2f) {
            prvTidyAddCharToLexer(lexer,0x2f);
            uVar21 = prvTidyReadChar(doc->docIn);
            if ((uVar21 < 0x80) && ((lexmap[uVar21] & 2) != 0)) {
LAB_0013183d:
              prvTidyUngetChar(uVar21,doc->docIn);
              uVar35 = (ulong)lexer->lexsize;
              goto LAB_001319b2;
            }
          }
          prvTidyUngetChar(uVar21,doc->docIn);
          goto LAB_00131a3c;
        }
        iVar23 = 0;
        if (((bVar16) && (uVar21 < 0x80)) && ((lexmap[uVar21] & 8) != 0)) {
          bVar16 = true;
        }
        else {
          bVar16 = false;
        }
      }
      else if ((uVar21 < 0x80) && ((lexmap[uVar21] & 2) != 0)) {
LAB_001319b2:
        iVar23 = 2;
      }
      else {
        ptVar32 = pNVar26->element;
        ptVar27 = lexer->lexbuf;
        uVar22 = prvTidytmbstrlen(ptVar32);
        iVar23 = prvTidytmbstrncasecmp(ptVar32,ptVar27 + uVar35,uVar22);
        if ((bVar16) && (iVar23 != 0)) {
          uVar22 = lexer->lexsize;
          while (uVar22 = uVar22 - 1, uVar18 <= uVar22) {
            prvTidyUngetChar((int)lexer->lexbuf[uVar22],doc->docIn);
          }
          prvTidyUngetChar(0x2f,doc->docIn);
          prvTidyUngetChar(0x3c,doc->docIn);
LAB_00131c30:
          if (bVar16) {
            lexer->txtstart = lexer->txtend;
            lexer->lexsize = lexer->txtend;
          }
          else {
            lexer->txtend = lexer->lexsize;
          }
          if (uVar21 == 0xffffffff) {
            prvTidyReportError(doc,pNVar26,(Node *)0x0,0xce);
          }
          pNVar26 = prvTidyTextToken(lexer);
          return pNVar26;
        }
        if (iVar23 == 0) {
          if ((int)local_78 < 1) {
            uVar22 = lexer->lexsize;
            while (uVar22 = uVar22 - 1, uVar18 <= uVar22) {
              prvTidyUngetChar((int)lexer->lexbuf[uVar22],doc->docIn);
            }
            prvTidyUngetChar(0x2f,doc->docIn);
            prvTidyUngetChar(0x3c,doc->docIn);
            lexer->lexsize = uVar18 - 2;
            goto LAB_00131c30;
          }
          local_78 = (ulong)((int)local_78 - 1);
        }
        iVar23 = 0;
        if (lexer->lexbuf[uVar18 - 2] != '\\') {
          pSVar34 = doc->docIn;
          lexer->lines = pSVar34->curline;
          lexer->columns = pSVar34->curcol - 3;
          BVar24 = prvTidyIsJavaScript(pNVar26);
          if (BVar24 != no) {
            prvTidyReportError(doc,(Node *)0x0,(Node *)0x0,0xe8);
            uVar30 = (ulong)lexer->lexsize;
            while (ptVar27 = lexer->lexbuf, uVar18 - 1 < uVar30) {
              ptVar27[uVar30] = ptVar27[uVar30 - 1 & 0xffffffff];
              uVar30 = uVar30 - 1;
            }
            ptVar27[uVar18 - 1] = '\\';
            lexer->lexsize = lexer->lexsize + 1;
          }
        }
      }
LAB_00131a85:
      pSVar34 = doc->docIn;
    } while( true );
  }
  isempty = no;
  local_50 = (AttVal *)0x0;
  lexer->token = (Node *)0x0;
  pSVar34 = doc->docIn;
  uVar4 = pSVar34->curcol;
  uVar8 = pSVar34->curline;
  lexer->lines = uVar8;
  lexer->columns = uVar4;
  lexer->waswhite = no;
  lexer->txtend = lexer->lexsize;
  lexer->txtstart = lexer->lexsize;
  iVar23 = 0;
  uVar21 = 0xffffffff;
LAB_00130dff:
  uVar18 = prvTidyReadChar(pSVar34);
  if (uVar18 == 0xffffffff) goto LAB_00131aab;
  if (lexer->insertspace != no) {
    prvTidyAddCharToLexer(lexer,0x20);
    lexer->waswhite = yes;
    lexer->insertspace = no;
  }
  if (mode == Preformatted && uVar18 == 0xa0) {
    uVar18 = 0x20;
  }
  prvTidyAddCharToLexer(lexer,uVar18);
  switch(lexer->state) {
  case LEX_CONTENT:
    if (uVar18 < 0x80) {
      if (((mode == IgnoreWhitespace & (byte)lexmap[uVar18] >> 3) == 1) &&
         (lexer->lexsize == lexer->txtstart + 1)) {
        lexer->lexsize = lexer->lexsize - 1;
        lexer->waswhite = no;
        uVar5 = doc->docIn->curcol;
        uVar9 = doc->docIn->curline;
        lexer->lines = uVar9;
        lexer->columns = uVar5;
        mode = IgnoreWhitespace;
      }
      else if (uVar18 == 0x3c) {
        lexer->state = LEX_GT;
      }
      else {
        if ((lexmap[uVar18] & 8) == 0) {
          if (mode != IgnoreMarkup && uVar18 == 0x26) {
            ParseEntity(doc,mode);
          }
          goto LAB_001313c7;
        }
        if (lexer->waswhite == no) {
          lexer->waswhite = yes;
          if (((mode - OtherNamespace < 0xfffffffe) && (uVar18 != 0x20)) && (lexer->lexsize != 0)) {
            lexer->lexbuf[lexer->lexsize - 1] = ' ';
          }
        }
        else if (mode - OtherNamespace < 0xfffffffe) {
          lexer->lexsize = lexer->lexsize - 1;
          uVar6 = doc->docIn->curcol;
          uVar10 = doc->docIn->curline;
          lexer->lines = uVar10;
          lexer->columns = uVar6;
        }
      }
    }
    else {
LAB_001313c7:
      mode = mode + (mode == IgnoreWhitespace);
LAB_001313cf:
      lexer->waswhite = no;
    }
    break;
  case LEX_GT:
    if (uVar18 == 0x2f) {
      uVar22 = prvTidyReadChar(doc->docIn);
      if (uVar22 == 0xffffffff) {
        prvTidyUngetChar(0xffffffff,doc->docIn);
      }
      else {
        prvTidyAddCharToLexer(lexer,uVar22);
        if ((uVar22 < 0x80) && ((lexmap[uVar22] & 2) != 0)) {
          uVar20 = lexer->lexsize - 3;
          lexer->lexsize = uVar20;
          lexer->txtend = uVar20;
          prvTidyUngetChar(uVar22,doc->docIn);
          lexer->state = LEX_ENDTAG;
          lexer->lexbuf[lexer->lexsize] = '\0';
          piVar2 = &doc->docIn->curcol;
          *piVar2 = *piVar2 + -2;
          if (lexer->txtstart < lexer->txtend) {
            if (mode == IgnoreWhitespace) goto LAB_00131add;
            goto LAB_00131af2;
          }
        }
        else {
          lexer->waswhite = no;
          lexer->state = LEX_CONTENT;
        }
      }
    }
    else if (mode == IgnoreMarkup) {
      lexer->waswhite = no;
      lexer->state = LEX_CONTENT;
      mode = IgnoreMarkup;
    }
    else {
      if (uVar18 == 0x3f) {
        uVar18 = lexer->lexsize - 2;
        lexer->lexsize = uVar18;
        lexer->state = LEX_PROCINSTR;
      }
      else if (uVar18 == 0x23) {
        uVar18 = lexer->lexsize - 2;
        lexer->lexsize = uVar18;
        lexer->state = LEX_JSTE;
      }
      else {
        if (uVar18 != 0x25) {
          if (uVar18 != 0x21) {
            if (uVar18 < 0x80) {
              if ((lexmap[uVar18] & 2) != 0) {
                prvTidyUngetChar(uVar18,doc->docIn);
                prvTidyUngetChar(0x3c,doc->docIn);
                uVar18 = lexer->lexsize - 2;
                lexer->lexsize = uVar18;
                lexer->txtend = uVar18;
                lexer->state = LEX_STARTTAG;
                if (uVar18 <= lexer->txtstart) break;
                goto LAB_00131af2;
              }
              if (uVar18 == 0x26) {
                prvTidyUngetChar(0x26,doc->docIn);
                lexer->lexsize = lexer->lexsize - 1;
              }
            }
            lexer->state = LEX_CONTENT;
            goto LAB_001313cf;
          }
          uVar22 = prvTidyReadChar(doc->docIn);
          if (uVar22 == 0x2d) {
            uVar22 = prvTidyReadChar(doc->docIn);
            if (uVar22 == 0x2d) {
              lexer->state = LEX_COMMENT;
              uVar18 = lexer->lexsize - 2;
              lexer->lexsize = uVar18;
              goto LAB_00131577;
            }
            prvTidyReportError(doc,(Node *)0x0,(Node *)0x0,0xe5);
LAB_001316d1:
            do {
              uVar22 = prvTidyReadChar(doc->docIn);
              if (uVar22 == 0x3e) goto LAB_001316f6;
            } while (uVar22 != 0xffffffff);
            prvTidyUngetChar(0xffffffff,doc->docIn);
LAB_001316f6:
            uVar18 = lexer->lexsize - 2;
            lexer->lexsize = uVar18;
            lexer->lexbuf[uVar18] = '\0';
            lexer->state = LEX_CONTENT;
          }
          else {
            if ((uVar22 & 0xffffffdf) == 0x44) {
              lexer->state = LEX_DOCTYPE;
              uVar22 = lexer->lexsize - 2;
              lexer->lexsize = uVar22;
              lexer->txtend = uVar22;
              do {
                uVar22 = prvTidyReadChar(doc->docIn);
                if ((uVar22 == 0xffffffff) || (uVar22 == 0x3e)) goto LAB_0013166d;
              } while ((0x7f < uVar22) || ((lexmap[uVar22] & 8) == 0));
              do {
                uVar22 = prvTidyReadChar(doc->docIn);
                if (((uVar22 == 0xffffffff) || (uVar22 == 0x3e)) || (0x7f < uVar22)) break;
              } while ((lexmap[uVar22] & 8) != 0);
LAB_0013166d:
              prvTidyUngetChar(uVar22,doc->docIn);
              if (lexer->txtend <= lexer->txtstart) {
                lexer->txtstart = lexer->lexsize;
                mode = IgnoreWhitespace;
                break;
              }
              goto LAB_00131af2;
            }
            if (uVar22 != 0x5b) goto LAB_001316d1;
            uVar18 = lexer->lexsize - 2;
            lexer->lexsize = uVar18;
            lexer->state = LEX_SECTION;
            lexer->txtend = uVar18;
            if (lexer->txtstart < uVar18) goto LAB_00131af2;
            lexer->txtstart = uVar18;
          }
          break;
        }
        uVar18 = lexer->lexsize - 2;
        lexer->lexsize = uVar18;
        lexer->state = LEX_ASP;
      }
LAB_00131577:
      lexer->txtend = uVar18;
      if (lexer->txtstart < uVar18) goto LAB_00131af2;
      lexer->txtstart = uVar18;
    }
    break;
  case LEX_ENDTAG:
    lexer->txtstart = lexer->lexsize - 1;
    piVar2 = &doc->docIn->curcol;
    *piVar2 = *piVar2 + 2;
    tVar17 = ParseTagName(doc);
    pNVar26 = TagToken(doc,EndTag);
    lexer->token = pNVar26;
    lexer->txtend = lexer->txtstart;
    lexer->lexsize = lexer->txtstart;
    uVar22 = (uint)tVar17;
    while (uVar22 != 0xffffffff) {
      if (uVar22 == 0x3e) {
        lexer->state = LEX_CONTENT;
        lexer->waswhite = no;
        goto LAB_00131aa2;
      }
      uVar22 = prvTidyReadChar(doc->docIn);
    }
    prvTidyFreeNode(doc,lexer->token);
    break;
  case LEX_STARTTAG:
    uVar22 = prvTidyReadChar(doc->docIn);
    if (lexer->lexsize != 0) {
      lexer->lexbuf[lexer->lexsize - 1] = (tmbchar)uVar22;
      uVar21 = lexer->lexsize - 1;
    }
    lexer->txtstart = uVar21;
    tVar17 = ParseTagName(doc);
    isempty = no;
    pNVar26 = TagToken(doc,StartTag);
    lexer->token = pNVar26;
    if (tVar17 != '>') {
      if (tVar17 == '/') {
        prvTidyUngetChar(0x2f,doc->docIn);
      }
      pLVar14 = doc->lexer;
      asp = (Node *)0x0;
      goto LAB_00131d3e;
    }
    pNVar33 = (Node *)0x0;
LAB_00132369:
    pNVar26->attributes = (AttVal *)pNVar33;
    lexer->txtend = lexer->txtstart;
    lexer->lexsize = lexer->txtstart;
    pDVar15 = pNVar26->tag;
    if (pDVar15 == (Dict *)0x0) {
      BVar24 = no;
      if (mode == Preformatted) {
        mode = Preformatted;
      }
      else if (pNVar26->type == StartTag) goto LAB_00132470;
    }
    else {
      TVar13 = pDVar15->id;
      if (TVar13 == TidyTag_PRE || mode == Preformatted) {
        mode = Preformatted;
LAB_001323c0:
        if ((TVar13 != TidyTag_HR) && (BVar24 = no, TVar13 != TidyTag_BR)) goto LAB_00132497;
      }
      else if ((pNVar26->type != StartTag) || ((pDVar15->model & 1) != 0)) goto LAB_001323c0;
LAB_00132470:
      uVar21 = prvTidyReadChar(doc->docIn);
      BVar24 = yes;
      if ((uVar21 != 10) && (uVar21 != 0xc)) {
        prvTidyUngetChar(uVar21,doc->docIn);
      }
    }
LAB_00132497:
    lexer->waswhite = BVar24;
    lexer->state = LEX_CONTENT;
    pNVar26 = lexer->token;
    pDVar15 = pNVar26->tag;
    if (pDVar15 == (Dict *)0x0) {
      if (mode != OtherNamespace) {
        prvTidyReportFatal(doc,(Node *)0x0,pNVar26,0xde);
      }
      goto LAB_00131aa2;
    }
    if (*(int *)((doc->config).value + 0x18) == 0) {
      uVar18 = pDVar15->versions;
      puVar1 = &doc->lexer->versions;
      *puVar1 = *puVar1 & (uVar18 | 0xe000);
      if (((uVar18 & 0xe000) != 0) &&
         ((*(int *)((doc->config).value + 0x20) == 0 ||
          ((pDVar15->id != TidyTag_NOBR && (pDVar15->id != TidyTag_WBR)))))) {
        prvTidyReportError(doc,(Node *)0x0,pNVar26,0xdd);
        if (pNVar26->tag != (Dict *)0x0) {
          TVar13 = pNVar26->tag->id;
          if (TVar13 == TidyTag_LAYER) {
            uVar18 = 2;
          }
          else if (TVar13 == TidyTag_NOBR) {
            uVar18 = 4;
          }
          else {
            if (TVar13 != TidyTag_SPACER) goto LAB_00132738;
            uVar18 = 1;
          }
          doc->badLayout = doc->badLayout | uVar18;
        }
      }
LAB_00132738:
      BVar24 = no;
    }
    else {
      BVar24 = yes;
    }
    prvTidyRepairDuplicateAttributes(doc,pNVar26,BVar24);
    goto LAB_00131aa2;
  case LEX_COMMENT:
    if (uVar18 == 0x2d) {
      uVar22 = prvTidyReadChar(doc->docIn);
      prvTidyAddCharToLexer(lexer,uVar22);
      if (uVar22 == 0x2d) {
        while( true ) {
          iVar23 = iVar23 + 1;
          uVar22 = prvTidyReadChar(doc->docIn);
          if (uVar22 == 0x3e) {
            if (iVar23 != 1) {
              prvTidyReportError(doc,(Node *)0x0,(Node *)0x0,0xe5);
            }
            uVar18 = lexer->lexsize - 2;
            lexer->lexsize = uVar18;
            lexer->txtend = uVar18;
            lexer->lexbuf[uVar18] = '\0';
            lexer->state = LEX_CONTENT;
            lexer->waswhite = no;
            pNVar26 = NewToken(doc,CommentTag);
            lexer->token = pNVar26;
            uVar21 = prvTidyReadChar(doc->docIn);
            if (uVar21 == 10) {
              pNVar26 = lexer->token;
              pNVar26->linebreak = yes;
              return pNVar26;
            }
            prvTidyUngetChar(uVar21,doc->docIn);
            goto LAB_00131aa2;
          }
          if (iVar23 == 1) {
            pSVar34 = doc->docIn;
            lexer->lines = pSVar34->curline;
            lexer->columns = pSVar34->curcol - 3;
          }
          if (*(int *)((doc->config).value + 0x27) != 0) {
            lexer->lexbuf[lexer->lexsize - 2] = '=';
          }
          if (uVar22 != 0x2d) break;
          prvTidyAddCharToLexer(lexer,0x2d);
        }
        lexer->lexbuf[lexer->lexsize - 1] = '=';
        prvTidyAddCharToLexer(lexer,uVar22);
      }
    }
    break;
  case LEX_DOCTYPE:
    prvTidyUngetChar(uVar18,doc->docIn);
    lexer->lexsize = lexer->lexsize - 1;
    pLVar14 = doc->lexer;
    local_80 = CONCAT44(local_80._4_4_,pLVar14->lexsize);
    local_70 = prvTidyNewNode(pLVar14->allocator,pLVar14);
    local_70->type = DocTypeTag;
    uVar21 = pLVar14->txtend;
    local_70->start = pLVar14->txtstart;
    local_70->end = uVar21;
    pLVar14->waswhite = no;
    local_60 = (AttVal *)((ulong)local_60._4_4_ << 0x20);
    local_64 = 1;
    iVar23 = 1;
    while (uVar21 = prvTidyReadChar(doc->docIn), uVar21 != 0xffffffff) {
      uVar18 = 0x20;
      if (uVar21 != 10) {
        uVar18 = uVar21;
      }
      uVar37 = uVar21;
      if (iVar23 != 4) {
        uVar37 = uVar18;
      }
      BVar24 = no;
      uVar25 = uVar37;
      if ((((0x7f < uVar37) || (iVar23 == 4)) || (BVar24 = no, (lexmap[uVar37] & 8) == 0)) ||
         (BVar24 = yes, uVar25 = uVar18, pLVar14->waswhite == no)) {
        local_78 = CONCAT44(local_78._4_4_,uVar21);
        prvTidyAddCharToLexer(pLVar14,uVar25);
        pLVar14->waswhite = BVar24;
        uVar21 = (uint)local_78;
        if (((uVar37 < 0x80) && ((lexmap[uVar18] & 8) != 0)) ||
           (((uint)local_78 == 0x5b || (iVar23 = 1, (uint)local_78 == 0x3e)))) {
          ptVar27 = prvTidytmbstrndup(doc->allocator,pLVar14->lexbuf + (int)(uint)local_80,
                                      ~(uint)local_80 + pLVar14->lexsize);
          local_70->element = ptVar27;
          if ((uVar21 == 0x5b) || (iVar23 = 0, uVar21 == 0x3e)) {
            pLVar14->lexsize = pLVar14->lexsize - 1;
            prvTidyUngetChar(uVar21,doc->docIn);
            iVar23 = 0;
          }
        }
      }
    }
    prvTidyReportError(doc,(Node *)0x0,(Node *)0x0,0xeb);
    prvTidyFreeNode(doc,local_70);
    lexer->token = (Node *)0x0;
    lexer->txtend = lexer->lexsize;
    lexer->lexbuf[lexer->lexsize] = '\0';
    lexer->state = LEX_CONTENT;
    lexer->waswhite = no;
    if (((lexer->doctype == 0) && (pNVar26 = lexer->token, pNVar26 != (Node *)0x0)) &&
       (*(int *)((doc->config).value + 0x18) == 0)) {
      pAVar28 = prvTidyGetAttrByName(pNVar26,"PUBLIC");
      if ((pAVar28 == (AttVal *)0x0) || (ptVar32 = pAVar28->value, ptVar32 == (ctmbstr)0x0)) {
        if ((pNVar26->element != (ctmbstr)0x0) &&
           (iVar23 = prvTidytmbstrcmp(pNVar26->element,"html"), iVar23 == 0)) {
          lexer->doctype = 0x60000;
          goto LAB_00131aa2;
        }
        lexer->doctype = 0;
      }
      else {
        for (lVar36 = 0x10; lVar36 != 0x270; lVar36 = lVar36 + 0x20) {
          s1 = *(ctmbstr *)((long)&W3C_Doctypes[0].score + lVar36);
          if ((s1 != (ctmbstr)0x0) && (iVar23 = prvTidytmbstrcasecmp(s1,ptVar32), iVar23 == 0)) {
            uVar18 = *(uint *)((long)&entities[0xfd].name + lVar36 + 4);
            if ((uVar18 & 0x41f00) != 0) {
              prvTidySetOptionBool(doc,TidyXmlOut,yes);
              prvTidySetOptionBool(doc,TidyXhtmlOut,yes);
              doc->lexer->isvoyager = yes;
            }
            goto LAB_00132782;
          }
        }
        uVar18 = 0;
LAB_00132782:
        (*doc->allocator->vtbl->free)(doc->allocator,pAVar28->value);
        allocator = doc->allocator;
        ptVar32 = GetFPIFromVers(uVar18);
        ptVar27 = prvTidytmbstrdup(allocator,ptVar32);
        pAVar28->value = ptVar27;
        lexer->doctype = uVar18;
        if (uVar18 == 0x60000) goto LAB_00131aa2;
      }
      prvTidyAdjustTags(doc);
    }
LAB_00131aa2:
    return lexer->token;
  case LEX_PROCINSTR:
    uVar35 = (ulong)lexer->txtstart;
    uVar22 = lexer->lexsize;
    if (uVar22 - lexer->txtstart == 3) {
      iVar19 = prvTidytmbstrncmp(lexer->lexbuf + uVar35,"php",3);
      if (iVar19 == 0) {
        lexer->state = LEX_PHP;
        break;
      }
      uVar35 = (ulong)lexer->txtstart;
      uVar22 = lexer->lexsize;
    }
    if (((uVar22 - (int)uVar35 == 4) &&
        (iVar19 = prvTidytmbstrncmp(lexer->lexbuf + uVar35,"xml",3), iVar19 == 0)) &&
       ((-1 < (long)lexer->lexbuf[lexer->txtstart + 3] &&
        ((lexmap[lexer->lexbuf[lexer->txtstart + 3]] & 8) != 0)))) {
      lexer->state = LEX_XMLDECL;
      local_50 = (AttVal *)0x0;
    }
    else {
      if ((*(int *)((doc->config).value + 0x36) != 0) || (lexer->isvoyager != no)) {
        if (uVar18 != 0x3f) break;
        uVar18 = prvTidyReadChar(doc->docIn);
        if (uVar18 == 0xffffffff) {
          prvTidyReportError(doc,(Node *)0x0,(Node *)0x0,0xec);
          pSVar34 = doc->docIn;
          uVar22 = 0xffffffff;
          goto LAB_001312af;
        }
        prvTidyAddCharToLexer(lexer,uVar18);
      }
      if (uVar18 == 0x3e) {
        uVar21 = lexer->lexsize;
        uVar18 = uVar21 - 1;
        lexer->lexsize = uVar18;
        if (uVar18 == 0) {
          lexer->txtend = 0;
          *lexer->lexbuf = '\0';
          pNVar26 = NewToken(doc,ProcInsTag);
          lexer->token = pNVar26;
          goto LAB_001325ef;
        }
        uVar22 = lexer->txtstart;
        ptVar27 = lexer->lexbuf;
        uVar35 = 0;
        goto LAB_001323ff;
      }
    }
    break;
  case LEX_CDATA:
    if (uVar18 != 0x5d) break;
    uVar22 = prvTidyReadChar(doc->docIn);
    pSVar34 = doc->docIn;
    if (uVar22 != 0x5d) goto LAB_001312af;
    uVar22 = prvTidyReadChar(pSVar34);
    if (uVar22 == 0x3e) {
      uVar18 = lexer->lexsize - 1;
      lexer->lexsize = uVar18;
      lexer->txtend = uVar18;
      lexer->lexbuf[uVar18] = '\0';
      lexer->state = LEX_CONTENT;
      lexer->waswhite = no;
      type = CDATATag;
      goto LAB_00131b70;
    }
    prvTidyUngetChar(uVar22,doc->docIn);
    pSVar34 = doc->docIn;
    uVar22 = 0x5d;
    goto LAB_001312af;
  case LEX_SECTION:
    if (uVar18 == 0x5d) {
      uVar22 = prvTidyReadChar(doc->docIn);
      if (uVar22 == 0x2d) {
        uVar22 = prvTidyReadChar(doc->docIn);
        if (uVar22 == 0x2d) {
          uVar22 = prvTidyReadChar(doc->docIn);
          if (uVar22 == 0x3e) goto LAB_00132426;
          prvTidyUngetChar(uVar22,doc->docIn);
          uVar22 = 0x2d;
          prvTidyUngetChar(0x2d,doc->docIn);
          pSVar34 = doc->docIn;
        }
        else {
          prvTidyUngetChar(uVar22,doc->docIn);
          pSVar34 = doc->docIn;
          uVar22 = 0x2d;
        }
        goto LAB_001312af;
      }
      if (uVar22 != 0x3e) goto LAB_001312a6;
LAB_00132426:
      uVar18 = lexer->lexsize - 1;
      lexer->lexsize = uVar18;
      lexer->txtend = uVar18;
      lexer->lexbuf[uVar18] = '\0';
      lexer->state = LEX_CONTENT;
      lexer->waswhite = no;
      type = SectionTag;
      goto LAB_00131b70;
    }
    if (((uVar18 == 0x5b) && (lexer->lexsize == lexer->txtstart + 6)) &&
       (iVar19 = prvTidytmbstrncmp(lexer->lexbuf + lexer->txtstart,"CDATA[",6), iVar19 == 0)) {
      lexer->state = LEX_CDATA;
      lexer->lexsize = lexer->lexsize - 6;
    }
    break;
  case LEX_ASP:
    if (uVar18 == 0x25) {
      uVar22 = prvTidyReadChar(doc->docIn);
      if (uVar22 != 0x3e) goto LAB_001312a6;
      uVar18 = lexer->lexsize - 1;
      lexer->lexsize = uVar18;
      lexer->txtend = uVar18;
      lexer->lexbuf[uVar18] = '\0';
      lexer->state = LEX_CONTENT;
      lexer->waswhite = no;
      type = AspTag;
      goto LAB_00131b70;
    }
    break;
  case LEX_JSTE:
    if (uVar18 == 0x23) {
      uVar22 = prvTidyReadChar(doc->docIn);
      if (uVar22 != 0x3e) goto LAB_001312a6;
      uVar18 = lexer->lexsize - 1;
      lexer->lexsize = uVar18;
      lexer->txtend = uVar18;
      lexer->lexbuf[uVar18] = '\0';
      lexer->state = LEX_CONTENT;
      lexer->waswhite = no;
      type = JsteTag;
      goto LAB_00131b70;
    }
    break;
  case LEX_PHP:
    if (uVar18 == 0x3f) {
      uVar22 = prvTidyReadChar(doc->docIn);
      if (uVar22 != 0x3e) goto LAB_001312a6;
      uVar18 = lexer->lexsize - 1;
      lexer->lexsize = uVar18;
      lexer->txtend = uVar18;
      lexer->lexbuf[uVar18] = '\0';
      lexer->state = LEX_CONTENT;
      lexer->waswhite = no;
      type = PhpTag;
      goto LAB_00131b70;
    }
    break;
  case LEX_XMLDECL:
    if (uVar18 < 0x80) {
      if ((uVar18 != 0x3f) && ((lexmap[uVar18] & 8) != 0)) break;
      if (uVar18 != 0x3f) goto LAB_001311e5;
    }
    else {
LAB_001311e5:
      local_48._0_4_ = 0;
      isempty = no;
      prvTidyUngetChar(uVar18,doc->docIn);
      ptVar27 = ParseAttribute(doc,&isempty,&asp,&php);
      if (ptVar27 == (tmbstr)0x0) goto LAB_00131c8a;
      pAVar28 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
      pAVar28->delim = 0;
      *(undefined4 *)&pAVar28->field_0x24 = 0;
      pAVar28->attribute = (tmbstr)0x0;
      pAVar28->next = (AttVal *)0x0;
      pAVar28->dict = (Attribute *)0x0;
      pAVar28->asp = (Node *)0x0;
      pAVar28->php = (Node *)0x0;
      pAVar28->value = (tmbstr)0x0;
      pAVar28->attribute = ptVar27;
      ptVar27 = ParseValue(doc,ptVar27,yes,&isempty,(int *)&local_48);
      pAVar28->value = ptVar27;
      pAVar28->delim = (int)local_48;
      pAVar29 = prvTidyFindAttribute(doc,pAVar28);
      pAVar28->dict = pAVar29;
      AddAttrToList(&local_50,pAVar28);
    }
    uVar22 = prvTidyReadChar(doc->docIn);
    if (uVar22 == 0x3e) {
LAB_00131c8a:
      lexer->lexsize = lexer->lexsize - 1;
      lexer->txtend = lexer->txtstart;
      lexer->lexbuf[lexer->txtstart] = '\0';
      lexer->state = LEX_CONTENT;
      lexer->waswhite = no;
      pNVar26 = NewToken(doc,XmlDecl);
      lexer->token = pNVar26;
      pNVar26->attributes = local_50;
      return pNVar26;
    }
LAB_001312a6:
    pSVar34 = doc->docIn;
LAB_001312af:
    prvTidyUngetChar(uVar22,pSVar34);
  }
  pSVar34 = doc->docIn;
  goto LAB_00130dff;
LAB_001323ff:
  uVar37 = uVar18 - uVar22;
  if (uVar18 - uVar22 == uVar35) {
LAB_00132591:
    uVar25 = uVar21 - 2;
    uVar35 = (ulong)uVar25;
    cVar12 = ptVar27[uVar35];
    if (cVar12 == '?') {
      lexer->lexsize = uVar25;
      uVar18 = uVar25;
    }
    else {
      uVar35 = (ulong)uVar18;
    }
    lexer->txtstart = uVar22 + uVar37;
    lexer->txtend = uVar18;
    ptVar27[uVar35] = '\0';
    pNVar26 = NewToken(doc,ProcInsTag);
    lexer->token = pNVar26;
    pNVar26->closed = (uint)(cVar12 == '?');
    ptVar27 = prvTidytmbstrndup(doc->allocator,
                                lexer->lexbuf + ((ulong)lexer->txtstart - (ulong)uVar37),uVar37);
    pNVar26 = lexer->token;
    pNVar26->element = ptVar27;
LAB_001325ef:
    lexer->state = LEX_CONTENT;
    lexer->waswhite = no;
    return pNVar26;
  }
  uVar37 = (uint)uVar35;
  if ((-1 < (long)ptVar27[uVar22 + uVar37]) && ((lexmap[ptVar27[uVar22 + uVar37]] & 8) != 0))
  goto LAB_00132591;
  uVar35 = uVar35 + 1;
  goto LAB_001323ff;
LAB_00131d3e:
  do {
    pSVar34 = doc->docIn;
    if (pSVar34 == (StreamIn *)0x0) {
      __assert_fail("doc->docIn != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/lexer.c"
                    ,0x310,"Bool EndOfInput(TidyDocImpl *)");
    }
    if ((pSVar34->pushed == no) && (BVar24 = prvTidyIsEOF(pSVar34), BVar24 != no)) {
LAB_001322b7:
      pNVar26 = lexer->token;
      pNVar33 = asp;
      if (isempty != no) {
        pNVar26->type = StartEndTag;
      }
      goto LAB_00132369;
    }
    ptVar27 = ParseAttribute(doc,&isempty,&php,(Node **)&local_48);
    pNVar26 = php;
    if (ptVar27 != (tmbstr)0x0) break;
    if (php == (Node *)0x0) {
      pNVar26 = (Node *)CONCAT44(local_48._4_4_,(int)local_48);
      if (pNVar26 == (Node *)0x0) goto LAB_001322b7;
      pAVar28 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
      pAVar28->asp = (Node *)0x0;
      pAVar28->php = (Node *)0x0;
      pAVar28->next = (AttVal *)0x0;
      pAVar28->dict = (Attribute *)0x0;
      pAVar28->delim = 0;
      *(undefined4 *)&pAVar28->field_0x24 = 0;
      pAVar28->attribute = (tmbstr)0x0;
      pAVar28->value = (tmbstr)0x0;
      pAVar28->php = pNVar26;
    }
    else {
      pAVar28 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
      pAVar28->asp = (Node *)0x0;
      pAVar28->php = (Node *)0x0;
      pAVar28->next = (AttVal *)0x0;
      pAVar28->dict = (Attribute *)0x0;
      pAVar28->delim = 0;
      *(undefined4 *)&pAVar28->field_0x24 = 0;
      pAVar28->attribute = (tmbstr)0x0;
      pAVar28->value = (tmbstr)0x0;
      pAVar28->asp = pNVar26;
    }
    AddAttrToList((AttVal **)&asp,pAVar28);
  } while( true );
  ptVar31 = ParseValue(doc,ptVar27,no,&isempty,&delim);
  if ((-1 < (long)*ptVar27) && ((lexmap[*ptVar27] & 2) != 0)) {
    uVar35 = 1;
    do {
      uVar21 = prvTidytmbstrlen(ptVar27);
      if (uVar21 <= uVar35) goto LAB_00131e7a;
      pcVar3 = ptVar27 + uVar35;
    } while ((-1 < (long)*pcVar3) && (uVar35 = uVar35 + 1, (lexmap[*pcVar3] & 4) != 0));
  }
  if ((*(int *)((doc->config).value + 0x18) == 0) ||
     (BVar24 = prvTidyIsValidXMLID(ptVar27), BVar24 == no)) {
    pAVar28 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
    pAVar28->next = (AttVal *)0x0;
    pAVar28->dict = (Attribute *)0x0;
    pAVar28->asp = (Node *)0x0;
    pAVar28->php = (Node *)0x0;
    *(undefined8 *)&pAVar28->delim = 0;
    pAVar28->attribute = ptVar27;
    pAVar28->value = ptVar31;
    if ((*ptVar27 == '\0') ||
       (uVar21 = prvTidytmbstrlen(ptVar27), ptVar27[(long)(int)uVar21 + -1] != '\"')) {
      pNVar26 = pLVar14->token;
      if (ptVar31 == (tmbstr)0x0) {
        uVar21 = 0xfe;
      }
      else {
        uVar21 = 0x113;
      }
    }
    else {
      pNVar26 = pLVar14->token;
      uVar21 = 0x107;
    }
    prvTidyReportAttrError(doc,pNVar26,pAVar28,uVar21);
    prvTidyFreeAttribute(doc,pAVar28);
  }
  else {
LAB_00131e7a:
    pAVar28 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
    pAVar28->next = (AttVal *)0x0;
    pAVar28->dict = (Attribute *)0x0;
    pAVar28->asp = (Node *)0x0;
    pAVar28->php = (Node *)0x0;
    *(undefined8 *)&pAVar28->delim = 0;
    pAVar28->delim = delim;
    pAVar28->attribute = ptVar27;
    pAVar28->value = ptVar31;
    pAVar29 = prvTidyFindAttribute(doc,pAVar28);
    pAVar28->dict = pAVar29;
    AddAttrToList((AttVal **)&asp,pAVar28);
  }
  goto LAB_00131d3e;
LAB_00131aab:
  if (lexer->state == LEX_COMMENT) {
    prvTidyReportError(doc,(Node *)0x0,(Node *)0x0,0xe5);
    lexer->txtend = lexer->lexsize;
    lexer->lexbuf[lexer->lexsize] = '\0';
    lexer->state = LEX_CONTENT;
    lexer->waswhite = no;
    type = CommentTag;
LAB_00131b70:
    pNVar26 = NewToken(doc,type);
  }
  else {
    if ((lexer->state != LEX_CONTENT) ||
       (lexer->txtend = lexer->lexsize, lexer->lexsize <= lexer->txtstart)) {
      return (Node *)0x0;
    }
    prvTidyUngetChar(0xffffffff,doc->docIn);
LAB_00131add:
    uVar18 = lexer->lexsize - 1;
    if (lexer->lexbuf[uVar18] == ' ') {
      lexer->lexsize = uVar18;
      lexer->txtend = uVar18;
    }
LAB_00131af2:
    pNVar26 = prvTidyTextToken(lexer);
  }
LAB_00130d3d:
  lexer->token = pNVar26;
  return pNVar26;
}

Assistant:

Node* TY_(GetToken)( TidyDocImpl* doc, GetTokenMode mode )
{
    Node *node;
    Lexer* lexer = doc->lexer;

    if (lexer->pushed || lexer->itoken)
    {
        /* Deal with previously returned duplicate inline token */
        if (lexer->itoken)
        {
            /* itoken rejected */
            if (lexer->pushed)
            {
                lexer->pushed = no;
                node = lexer->itoken;
                GTDBG(doc,"lex-itoken", node);
                return node;
            }
            /* itoken has been accepted */
            lexer->itoken = NULL;
        }
            
        /* duplicate inlines in preference to pushed text nodes when appropriate */
        lexer->pushed = no;
        if (lexer->token->type != TextNode
            || !(lexer->insert || lexer->inode)) {
            node = lexer->token;
            GTDBG(doc,"lex-token", node);
            return node;
        }
        lexer->itoken = TY_(InsertedToken)( doc );
        node = lexer->itoken;
        GTDBG(doc,"lex-inserted", node);
        return node;
    }

    assert( !(lexer->pushed || lexer->itoken) );

    /* at start of block elements, unclosed inline
       elements are inserted into the token stream */
    if (lexer->insert || lexer->inode) {
        /*\ Issue #92: could fix by the following, but instead chose not to stack these 2
         *  if ( !(lexer->insert && (nodeIsINS(lexer->insert) || nodeIsDEL(lexer->insert))) ) {
        \*/
        lexer->token = TY_(InsertedToken)( doc );
        node = lexer->token;
        GTDBG(doc,"lex-inserted2", node);
        return node;
    }

    if (mode == CdataContent)
    {
        assert( lexer->parent != NULL );
        node = GetCDATA(doc, lexer->parent);
        GTDBG(doc,"lex-cdata", node);
        return node;
    }

    return GetTokenFromStream( doc, mode );
}